

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O3

int __thiscall NetQuantize::quantize_convolutiondepthwise(NetQuantize *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar5;
  Layer *pLVar6;
  void *__ptr;
  pointer pMVar7;
  pointer pMVar8;
  void *__ptr_00;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  Allocator *pAVar11;
  int *piVar12;
  pointer __ptr_01;
  long *plVar13;
  pointer pMVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  iterator iVar18;
  size_t sVar19;
  iterator iVar20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *this_00;
  long lVar21;
  pointer piVar22;
  long lVar23;
  size_t sVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  void *pvVar28;
  Option opt_q;
  char key [256];
  undefined1 local_308 [32];
  Allocator *local_2e8;
  int iStack_2e0;
  int local_2dc;
  int iStack_2d8;
  undefined8 uStack_2d4;
  size_t local_2c8;
  NetQuantize *local_2c0;
  pointer local_2b8;
  undefined8 local_2b0;
  pointer local_2a8;
  ulong local_2a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_298;
  _Base_ptr local_290;
  Option *local_288;
  _Base_ptr local_280;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_278;
  Mat local_270;
  Mat local_228;
  Mat local_1e0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  Option local_178;
  char local_138 [264];
  
  pvVar5 = (this->super_ModelWriter).layers;
  uVar25 = (uint)((ulong)((long)(pvVar5->
                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar5->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar25) {
    local_278 = &this->blob_int8scale_table;
    local_280 = &(this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_00 = &this->weight_int8scale_table;
    local_290 = &(this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_288 = &(this->super_ModelWriter).super_Net.opt;
    uVar26 = (ulong)(uVar25 & 0x7fffffff);
    uVar27 = 0;
    do {
      iVar16 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar27]->type);
      if ((iVar16 == 0) &&
         (iVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::find(&local_278->_M_t,
                          &(((this->super_ModelWriter).layers)->
                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar27]->name),
         iVar18._M_node != local_280)) {
        sprintf(local_138,"%s_param_0",
                ((((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar27]->name)._M_dataplus._M_p);
        local_308._0_8_ = local_308 + 0x10;
        sVar19 = strlen(local_138);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_308,local_138,local_138 + sVar19);
        local_298 = this_00;
        iVar20 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                 ::find(&this_00->_M_t,(key_type *)local_308);
        if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
          operator_delete((void *)local_308._0_8_);
        }
        if (iVar20._M_node == local_290) {
          quantize_convolutiondepthwise();
          return -1;
        }
        pLVar6 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar27];
        __ptr = *(void **)(iVar18._M_node + 2);
        pMVar7 = (pointer)iVar18._M_node[2]._M_parent;
        local_2a8 = (pointer)iVar18._M_node[2]._M_left;
        uVar1 = *(undefined4 *)&iVar18._M_node[2]._M_right;
        pMVar8 = *(pointer *)(iVar18._M_node + 3);
        local_198 = iVar18._M_node[3]._M_parent;
        uStack_190 = iVar18._M_node[3]._M_left;
        uVar2 = *(undefined4 *)&iVar18._M_node[3]._M_right;
        local_2b0 = *(undefined8 *)(iVar18._M_node + 4);
        if (pMVar7 != (pointer)0x0) {
          LOCK();
          *(_Rb_tree_color *)&pMVar7->data = *(_Rb_tree_color *)&pMVar7->data + _S_black;
          UNLOCK();
        }
        __ptr_00 = *(void **)(iVar20._M_node + 2);
        p_Var9 = iVar20._M_node[2]._M_parent;
        p_Var10 = iVar20._M_node[2]._M_left;
        iVar16 = *(int *)&iVar20._M_node[2]._M_right;
        pAVar11 = *(Allocator **)(iVar20._M_node + 3);
        local_188 = *(undefined4 *)&iVar20._M_node[3]._M_parent;
        uStack_184 = *(undefined4 *)((long)&iVar20._M_node[3]._M_parent + 4);
        uStack_180 = *(undefined4 *)&iVar20._M_node[3]._M_left;
        uStack_17c = *(undefined4 *)((long)&iVar20._M_node[3]._M_left + 4);
        uVar3 = *(undefined4 *)&iVar20._M_node[3]._M_right;
        piVar22 = *(pointer *)(iVar20._M_node + 4);
        if (p_Var9 != (_Base_ptr)0x0) {
          LOCK();
          p_Var9->_M_color = p_Var9->_M_color + _S_black;
          UNLOCK();
        }
        local_2a0 = uVar26;
        fprintf(_stderr,"quantize_convolutiondepthwise %s\n",(pLVar6->name)._M_dataplus._M_p);
        local_2c8 = 0;
        local_308._0_8_ = (pointer)0x0;
        local_308._8_4_ = 0;
        local_308._12_4_ = 0;
        local_308._16_4_ = 0;
        local_308._20_4_ = 0;
        local_308._24_4_ = 0;
        iStack_2d8 = 0;
        uStack_2d4._0_4_ = 0;
        uStack_2d4._4_4_ = 0;
        local_2e8 = (Allocator *)0x0;
        iStack_2e0 = 0;
        local_2dc = 0;
        ncnn::Mat::create((Mat *)local_308,*(int *)((long)&pLVar6[1].type._M_dataplus._M_p + 4),1,
                          (Allocator *)0x0);
        bVar15 = true;
        if (((pointer)local_308._0_8_ != (pointer)0x0) && ((long)uStack_2d4._4_4_ * local_2c8 != 0))
        {
          iVar4 = (int)pLVar6[1].type._M_string_length;
          iVar17 = *(int *)((long)&pLVar6[1].type._M_dataplus._M_p + 4) / iVar4;
          local_2c0 = this;
          local_2b8 = piVar22;
          if (0 < iVar4) {
            sVar24 = (size_t)iVar17;
            lVar23 = 0;
            lVar21 = 0;
            pvVar28 = __ptr_00;
            do {
              local_178.lightmode = local_288->lightmode;
              local_178._1_3_ = *(undefined3 *)&local_288->field_0x1;
              local_178.num_threads = local_288->num_threads;
              local_178.workspace_allocator = local_288->workspace_allocator;
              local_178.openmp_blocktime = local_288->openmp_blocktime;
              local_178.use_winograd_convolution = local_288->use_winograd_convolution;
              local_178.use_sgemm_convolution = local_288->use_sgemm_convolution;
              local_178.use_int8_inference = local_288->use_int8_inference;
              local_178.use_vulkan_compute = local_288->use_vulkan_compute;
              uVar26._0_1_ = local_288->use_bf16_storage;
              uVar26._1_1_ = local_288->use_fp16_packed;
              uVar26._2_1_ = local_288->use_fp16_storage;
              uVar26._3_1_ = local_288->use_fp16_arithmetic;
              uVar26._4_1_ = local_288->use_int8_packed;
              uVar26._5_1_ = local_288->use_int8_storage;
              uVar26._6_1_ = local_288->use_int8_arithmetic;
              uVar26._7_1_ = local_288->use_packing_layout;
              local_178.use_shader_pack8 = local_288->use_shader_pack8;
              local_178.use_subgroup_basic = local_288->use_subgroup_basic;
              local_178.use_subgroup_vote = local_288->use_subgroup_vote;
              local_178.use_subgroup_ballot = local_288->use_subgroup_ballot;
              local_178.use_subgroup_shuffle = local_288->use_subgroup_shuffle;
              local_178.use_image_storage = local_288->use_image_storage;
              local_178.use_tensor_storage = local_288->use_tensor_storage;
              local_178.use_reserved_0 = local_288->use_reserved_0;
              local_178.flush_denormals = local_288->flush_denormals;
              local_178.use_local_pool_allocator = local_288->use_local_pool_allocator;
              local_178.use_shader_local_memory = local_288->use_shader_local_memory;
              local_178.use_cooperative_matrix = local_288->use_cooperative_matrix;
              local_178.use_winograd23_convolution = local_288->use_winograd23_convolution;
              local_178.use_winograd43_convolution = local_288->use_winograd43_convolution;
              local_178.use_winograd63_convolution = local_288->use_winograd63_convolution;
              local_178.use_a53_a55_optimized_kernel = local_288->use_a53_a55_optimized_kernel;
              local_178.use_reserved_7 = local_288->use_reserved_7;
              local_178.use_reserved_8 = local_288->use_reserved_8;
              local_178.use_reserved_9 = local_288->use_reserved_9;
              local_178.use_reserved_10 = local_288->use_reserved_10;
              local_178.use_reserved_11 = local_288->use_reserved_11;
              local_178.blob_allocator = local_2e8;
              local_178._32_8_ = uVar26 & 0xffffffffffffff;
              local_228.elemsize =
                   (size_t)pLVar6[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish;
              local_228.data =
                   (void *)(local_228.elemsize * lVar23 +
                           (long)pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
              local_228.elempack =
                   *(int *)&pLVar6[1].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
              local_228.allocator =
                   *(Allocator **)
                    &pLVar6[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data;
              local_228.refcount = (int *)0x0;
              local_270.elemsize = CONCAT44(local_308._20_4_,local_308._16_4_);
              local_270.data = (void *)(local_308._0_8_ + local_270.elemsize * lVar23);
              local_270.refcount = (int *)0x0;
              local_270.elempack = local_308._24_4_;
              local_270.allocator = local_2e8;
              local_228.dims = 1;
              local_228.h = 1;
              local_228.d = 1;
              local_228.c = 1;
              local_270.dims = 1;
              local_270.h = 1;
              local_270.d = 1;
              local_270.c = 1;
              local_1e0.refcount = (int *)0x0;
              local_1e0.dims = 1;
              local_1e0.w = 1;
              local_1e0.h = 1;
              local_1e0.d = 1;
              local_1e0.c = 1;
              local_1e0.cstep = 1;
              local_270.w = iVar17;
              local_270.cstep = sVar24;
              local_228.w = iVar17;
              local_228.cstep = sVar24;
              local_1e0.data = pvVar28;
              local_1e0.elemsize = (size_t)p_Var10;
              local_1e0.elempack = iVar16;
              local_1e0.allocator = pAVar11;
              ncnn::quantize_to_int8(&local_228,&local_270,&local_1e0,&local_178);
              if (local_1e0.refcount != (int *)0x0) {
                LOCK();
                *local_1e0.refcount = *local_1e0.refcount + -1;
                UNLOCK();
                if (*local_1e0.refcount == 0) {
                  if (local_1e0.allocator == (Allocator *)0x0) {
                    if (local_1e0.data != (void *)0x0) {
                      free(local_1e0.data);
                    }
                  }
                  else {
                    (*(local_1e0.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              if (local_270.refcount != (int *)0x0) {
                LOCK();
                *local_270.refcount = *local_270.refcount + -1;
                UNLOCK();
                if (*local_270.refcount == 0) {
                  if (local_270.allocator == (Allocator *)0x0) {
                    if ((pointer)local_270.data != (pointer)0x0) {
                      free(local_270.data);
                    }
                  }
                  else {
                    (*(local_270.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              if (local_228.refcount != (int *)0x0) {
                LOCK();
                *local_228.refcount = *local_228.refcount + -1;
                UNLOCK();
                if (*local_228.refcount == 0) {
                  if (local_228.allocator == (Allocator *)0x0) {
                    if ((pointer)local_228.data != (pointer)0x0) {
                      free(local_228.data);
                    }
                  }
                  else {
                    (*(local_228.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              lVar21 = lVar21 + 1;
              lVar23 = lVar23 + sVar24;
              pvVar28 = (void *)((long)pvVar28 + (long)p_Var10);
            } while (lVar21 < (int)pLVar6[1].type._M_string_length);
          }
          piVar22 = local_2b8;
          this = local_2c0;
          if (&pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == (pointer *)local_308) {
            bVar15 = false;
          }
          else {
            piVar12 = (int *)CONCAT44(local_308._12_4_,local_308._8_4_);
            if (piVar12 != (int *)0x0) {
              LOCK();
              *piVar12 = *piVar12 + 1;
              UNLOCK();
            }
            piVar12 = *(int **)&pLVar6[1].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data;
            if (piVar12 != (int *)0x0) {
              LOCK();
              *piVar12 = *piVar12 + -1;
              UNLOCK();
              if (*piVar12 == 0) {
                __ptr_01 = pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                plVar13 = *(long **)&pLVar6[1].top_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data;
                if (plVar13 == (long *)0x0) {
                  if (__ptr_01 != (pointer)0x0) {
                    free(__ptr_01);
                  }
                }
                else {
                  (**(code **)(*plVar13 + 0x18))();
                }
              }
            }
            pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_308._0_8_;
            *(ulong *)&pLVar6[1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data = CONCAT44(local_308._12_4_,local_308._8_4_);
            pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(local_308._20_4_,local_308._16_4_);
            *(undefined4 *)
             &pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = local_308._24_4_;
            *(Allocator **)
             &pLVar6[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data = local_2e8;
            *(int *)&pLVar6[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish = iStack_2e0;
            *(int *)((long)&pLVar6[1].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4) = local_2dc;
            *(int *)&pLVar6[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage = iStack_2d8;
            *(int *)((long)&pLVar6[1].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4) = (int)uStack_2d4;
            *(int *)&pLVar6[2]._vptr_Layer = uStack_2d4._4_4_;
            pLVar6[2].one_blob_only = (bool)(undefined1)local_2c8;
            pLVar6[2].support_inplace = (bool)local_2c8._1_1_;
            pLVar6[2].support_vulkan = (bool)local_2c8._2_1_;
            pLVar6[2].support_packing = (bool)local_2c8._3_1_;
            pLVar6[2].support_bf16_storage = (bool)local_2c8._4_1_;
            pLVar6[2].support_fp16_storage = (bool)local_2c8._5_1_;
            pLVar6[2].support_int8_storage = (bool)local_2c8._6_1_;
            pLVar6[2].support_image_storage = (bool)local_2c8._7_1_;
            bVar15 = false;
          }
        }
        piVar12 = (int *)CONCAT44(local_308._12_4_,local_308._8_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_2e8 == (Allocator *)0x0) {
              if ((pointer)local_308._0_8_ != (pointer)0x0) {
                free((void *)local_308._0_8_);
              }
            }
            else {
              (*local_2e8->_vptr_Allocator[3])();
            }
          }
        }
        if (!bVar15) {
          *(undefined4 *)((long)&pLVar6[1].type._M_string_length + 4) = 1;
          if (p_Var9 != (_Base_ptr)0x0) {
            LOCK();
            p_Var9->_M_color = p_Var9->_M_color + _S_black;
            UNLOCK();
          }
          piVar12 = *(int **)&pLVar6[2].name.field_2;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + -1;
            UNLOCK();
            if (*piVar12 == 0) {
              pvVar28 = (void *)pLVar6[2].name._M_string_length;
              plVar13 = (long *)pLVar6[2].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
              if (plVar13 == (long *)0x0) {
                if (pvVar28 != (void *)0x0) {
                  free(pvVar28);
                }
              }
              else {
                (**(code **)(*plVar13 + 0x18))();
              }
            }
          }
          pLVar6[2].name._M_string_length = (size_type)__ptr_00;
          pLVar6[2].name.field_2._M_allocated_capacity = (size_type)p_Var9;
          *(_Base_ptr *)((long)&pLVar6[2].name.field_2 + 8) = p_Var10;
          *(int *)&pLVar6[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data = iVar16;
          pLVar6[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)pAVar11;
          *(undefined4 *)
           &pLVar6[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = local_188;
          *(undefined4 *)
           ((long)&pLVar6[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 4) = uStack_184;
          *(undefined4 *)
           &pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data = uStack_180;
          *(undefined4 *)
           ((long)&pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 4) = uStack_17c;
          *(undefined4 *)
           &pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = uVar3;
          pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = piVar22;
          if (pMVar7 != (pointer)0x0) {
            LOCK();
            *(_Rb_tree_color *)&pMVar7->data = *(_Rb_tree_color *)&pMVar7->data + _S_black;
            UNLOCK();
          }
          pMVar14 = pLVar6[2].bottom_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (pMVar14 != (pointer)0x0) {
            LOCK();
            *(int *)&pMVar14->data = *(int *)&pMVar14->data + -1;
            UNLOCK();
            if (*(int *)&pMVar14->data == 0) {
              pvVar28 = pLVar6[2].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pMVar14 = pLVar6[2].top_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (pMVar14 == (pointer)0x0) {
                if (pvVar28 != (void *)0x0) {
                  free(pvVar28);
                }
              }
              else {
                (**(code **)((long)pMVar14->data + 0x18))();
              }
            }
          }
          pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start = __ptr;
          pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = pMVar7;
          pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_2a8;
          *(undefined4 *)
           &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data = uVar1;
          pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = pMVar8;
          *(undefined4 *)
           &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (undefined4)local_198;
          *(undefined4 *)
           ((long)&pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = local_198._4_4_;
          *(undefined4 *)&pLVar6[3]._vptr_Layer = (undefined4)uStack_190;
          *(undefined4 *)((long)&pLVar6[3]._vptr_Layer + 4) = uStack_190._4_4_;
          pLVar6[3].one_blob_only = (bool)(char)uVar2;
          pLVar6[3].support_inplace = (bool)(char)((uint)uVar2 >> 8);
          pLVar6[3].support_vulkan = (bool)(char)((uint)uVar2 >> 0x10);
          pLVar6[3].support_packing = (bool)(char)((uint)uVar2 >> 0x18);
          pLVar6[3].support_tensor_storage = (bool)(undefined1)local_2b0;
          pLVar6[3].support_reserved_00 = (bool)local_2b0._1_1_;
          pLVar6[3].support_reserved_0 = (bool)local_2b0._2_1_;
          pLVar6[3].support_reserved_1 = (bool)local_2b0._3_1_;
          pLVar6[3].support_reserved_2 = (bool)local_2b0._4_1_;
          pLVar6[3].support_reserved_3 = (bool)local_2b0._5_1_;
          pLVar6[3].support_reserved_4 = (bool)local_2b0._6_1_;
          pLVar6[3].support_reserved_5 = (bool)local_2b0._7_1_;
        }
        if (p_Var9 != (_Base_ptr)0x0) {
          LOCK();
          p_Var9->_M_color = p_Var9->_M_color - _S_black;
          UNLOCK();
          if (p_Var9->_M_color == _S_red) {
            if (pAVar11 == (Allocator *)0x0) {
              if (__ptr_00 != (void *)0x0) {
                free(__ptr_00);
              }
            }
            else {
              (*pAVar11->_vptr_Allocator[3])(pAVar11,__ptr_00);
            }
          }
        }
        if (pMVar7 != (pointer)0x0) {
          LOCK();
          *(_Rb_tree_color *)&pMVar7->data = *(_Rb_tree_color *)&pMVar7->data - _S_black;
          UNLOCK();
          if (*(_Rb_tree_color *)&pMVar7->data == _S_red) {
            if (pMVar8 == (pointer)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (**(code **)((long)pMVar8->data + 0x18))(pMVar8,__ptr);
            }
          }
        }
        this_00 = local_298;
        uVar26 = local_2a0;
        if (bVar15) {
          return -100;
        }
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar26);
  }
  return 0;
}

Assistant:

int NetQuantize::quantize_convolutiondepthwise()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // find convolutiondepthwise layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // Convolution - quantize weight from fp32 to int8
        ncnn::ConvolutionDepthWise* convdw = (ncnn::ConvolutionDepthWise*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_convolutiondepthwise %s\n", convdw->name.c_str());

        {
            ncnn::Mat int8_weight_data(convdw->weight_data_size, (size_t)1u);
            if (int8_weight_data.empty())
                return -100;

            const int weight_data_size_g = convdw->weight_data_size / convdw->group;

            for (int g = 0; g < convdw->group; g++)
            {
                ncnn::Option opt_q = opt;
                opt_q.blob_allocator = int8_weight_data.allocator;
                opt_q.use_packing_layout = false;

                const ncnn::Mat weight_data_g = convdw->weight_data.range(weight_data_size_g * g, weight_data_size_g);
                ncnn::Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
                const ncnn::Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
                ncnn::quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
            }

            convdw->weight_data = int8_weight_data;
        }

        convdw->int8_scale_term = 1;
        convdw->weight_data_int8_scales = weight_data_int8_scales;
        convdw->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}